

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::emit_array_copy
          (CompilerMSL *this,string *lhs,uint32_t rhs_id,StorageClass lhs_storage,
          StorageClass rhs_storage)

{
  Variant *pVVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4;
  undefined4 uVar3;
  SPVFuncImpl spv_func;
  undefined8 in_RAX;
  SPIRVariable *pSVar4;
  runtime_error *prVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  byte bVar9;
  byte bVar10;
  bool bVar11;
  char *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  uint32_t local_70;
  undefined4 local_6c;
  SPIRType *local_68;
  string local_60;
  undefined4 local_40;
  undefined4 local_3c;
  size_t local_38;
  uint7 uVar8;
  
  bVar9 = (byte)(0x1c8 >> ((byte)lhs_storage & 0x1f)) & lhs_storage < StorageClassPushConstant;
  uVar8 = (uint7)(uint3)(rhs_id >> 8);
  uVar7 = (undefined4)CONCAT71(uVar8,1);
  uVar6 = 0;
  if (rhs_storage < StorageClassPushConstant) {
    uVar3 = 0x101;
    if ((0x1c2U >> (rhs_storage & 0x1f) & 1) != 0) {
      uVar6 = 1;
      if (bVar9 == 0) {
        uVar3 = 0;
        uVar7 = (undefined4)CONCAT71(uVar8,1);
      }
      else {
        uVar7 = 0;
        if ((this->msl_options).force_native_arrays == false) {
          uVar3 = 0;
          if ((this->is_using_builtin_array & 1U) == 0) {
            CompilerGLSL::to_expression_abi_cxx11_(&local_60,&this->super_CompilerGLSL,rhs_id,true);
            CompilerGLSL::
            statement<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                      (&this->super_CompilerGLSL,lhs,(char (*) [4])0x2f38c7,&local_60,
                       (char (*) [2])0x2d9bde);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p == &local_60.field_2) {
              return;
            }
            goto LAB_0026c73c;
          }
        }
        else {
          uVar3 = 0;
        }
      }
    }
  }
  else {
    uVar3 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  }
  local_6c = uVar6;
  local_40 = uVar3;
  local_3c = uVar7;
  local_68 = Compiler::expression_type((Compiler *)this,rhs_id);
  pSVar4 = Compiler::maybe_get_backing_variable((Compiler *)this,rhs_id);
  pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
           ptr;
  if ((pVVar1[rhs_id].type == TypeConstant) ||
     ((((pSVar4 != (SPIRVariable *)0x0 && (pSVar4->remapped_variable == true)) &&
       (pSVar4->statically_assigned == true)) &&
      (pVVar1[(pSVar4->static_expression).id].type == TypeConstant)))) {
    bVar11 = false;
  }
  else {
    bVar11 = rhs_storage != StorageClassUniform;
  }
  uVar2 = (local_68->array).super_VectorView<unsigned_int>.buffer_size;
  spv_func = SPVFuncImplArrayCopy;
  local_78 = lhs;
  local_70 = rhs_id;
  if (1 < uVar2) {
    if (6 < uVar2) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Cannot support this many dimensions for arrays of arrays.","")
      ;
      ::std::runtime_error::runtime_error(prVar5,(string *)&local_60);
      *(undefined ***)prVar5 = &PTR__runtime_error_00357118;
      __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    spv_func = (SPVFuncImpl)uVar2 | SPVFuncImplArrayCopyMultidimBase;
  }
  bVar10 = bVar9 ^ 1;
  add_spv_func_and_recompile(this,spv_func);
  ts_4 = local_78;
  if (bVar11 || bVar10 != 0) {
    if (!bVar11 && lhs_storage == StorageClassWorkgroup) {
      local_80 = "FromConstantToThreadGroup";
    }
    else if ((char)local_3c == '\0') {
      local_80 = "FromStackToStack";
    }
    else if (lhs_storage == StorageClassWorkgroup && (char)local_40 == '\0') {
      local_80 = "FromStackToThreadGroup";
    }
    else if (rhs_storage == StorageClassWorkgroup && bVar10 == 0) {
      local_80 = "FromThreadGroupToStack";
    }
    else if ((lhs_storage ^ StorageClassWorkgroup) == StorageClassUniformConstant &&
             (rhs_storage ^ StorageClassWorkgroup) == StorageClassUniformConstant) {
      local_80 = "FromThreadGroupToThreadGroup";
    }
    else if ((lhs_storage ^ StorageClassStorageBuffer) == StorageClassUniformConstant &&
             (rhs_storage ^ StorageClassStorageBuffer) == StorageClassUniformConstant) {
      local_80 = "FromDeviceToDevice";
    }
    else if (!bVar11 && lhs_storage == StorageClassStorageBuffer) {
      local_80 = "FromConstantToDevice";
    }
    else if ((lhs_storage ^ StorageClassStorageBuffer) == StorageClassUniformConstant &&
             (rhs_storage ^ StorageClassWorkgroup) == StorageClassUniformConstant) {
      local_80 = "FromThreadGroupToDevice";
    }
    else if ((char)local_40 == '\0' && lhs_storage == StorageClassStorageBuffer) {
      local_80 = "FromStackToDevice";
    }
    else if ((lhs_storage ^ StorageClassWorkgroup) == StorageClassUniformConstant &&
             (rhs_storage ^ StorageClassStorageBuffer) == StorageClassUniformConstant) {
      local_80 = "FromDeviceToThreadGroup";
    }
    else {
      if (rhs_storage != StorageClassStorageBuffer || bVar10 != 0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"Unknown storage class used for copying arrays.","");
        ::std::runtime_error::runtime_error(prVar5,(string *)&local_60);
        *(undefined ***)prVar5 = &PTR__runtime_error_00357118;
        __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_80 = "FromDeviceToStack";
    }
  }
  else {
    local_80 = "FromConstantToStack";
  }
  if ((bVar9 == 0) || ((this->msl_options).force_native_arrays != false)) {
    if (((char)local_6c == '\0') || ((this->msl_options).force_native_arrays != false)) {
      local_38 = (local_68->array).super_VectorView<unsigned_int>.buffer_size;
      CompilerGLSL::to_expression_abi_cxx11_(&local_60,&this->super_CompilerGLSL,local_70,true);
      CompilerGLSL::
      statement<char_const(&)[13],char_const*&,unsigned_long,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,(char (*) [13])0x2ea0c8,&local_80,&local_38,
                 (char (*) [2])0x2f3fa1,ts_4,(char (*) [3])0x2f06f8,&local_60,(char (*) [3])0x2d9bdd
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return;
      }
    }
    else {
      local_38 = (local_68->array).super_VectorView<unsigned_int>.buffer_size;
      CompilerGLSL::to_expression_abi_cxx11_(&local_60,&this->super_CompilerGLSL,local_70,true);
      CompilerGLSL::
      statement<char_const(&)[13],char_const*&,unsigned_long,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string,char_const(&)[12]>
                (&this->super_CompilerGLSL,(char (*) [13])0x2ea0c8,&local_80,&local_38,
                 (char (*) [2])0x2f3fa1,ts_4,(char (*) [3])0x2f06f8,&local_60,
                 (char (*) [12])".elements);");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return;
      }
    }
  }
  else {
    local_38 = (local_68->array).super_VectorView<unsigned_int>.buffer_size;
    CompilerGLSL::to_expression_abi_cxx11_(&local_60,&this->super_CompilerGLSL,local_70,true);
    CompilerGLSL::
    statement<char_const(&)[13],char_const*&,unsigned_long,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[12],std::__cxx11::string,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [13])0x2ea0c8,&local_80,&local_38,
               (char (*) [2])0x2f3fa1,ts_4,(char (*) [12])".elements, ",&local_60,
               (char (*) [3])0x2d9bdd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return;
    }
  }
LAB_0026c73c:
  operator_delete(local_60._M_dataplus._M_p);
  return;
}

Assistant:

void CompilerMSL::emit_array_copy(const string &lhs, uint32_t rhs_id, StorageClass lhs_storage,
                                  StorageClass rhs_storage)
{
	// Allow Metal to use the array<T> template to make arrays a value type.
	// This, however, cannot be used for threadgroup address specifiers, so consider the custom array copy as fallback.
	bool lhs_thread = (lhs_storage == StorageClassOutput || lhs_storage == StorageClassFunction ||
	                   lhs_storage == StorageClassGeneric || lhs_storage == StorageClassPrivate);
	bool rhs_thread = (rhs_storage == StorageClassInput || rhs_storage == StorageClassFunction ||
	                   rhs_storage == StorageClassGeneric || rhs_storage == StorageClassPrivate);

	// If threadgroup storage qualifiers are *not* used:
	// Avoid spvCopy* wrapper functions; Otherwise, spvUnsafeArray<> template cannot be used with that storage qualifier.
	if (lhs_thread && rhs_thread && !using_builtin_array())
	{
		statement(lhs, " = ", to_expression(rhs_id), ";");
	}
	else
	{
		// Assignment from an array initializer is fine.
		auto &type = expression_type(rhs_id);
		auto *var = maybe_get_backing_variable(rhs_id);

		// Unfortunately, we cannot template on address space in MSL,
		// so explicit address space redirection it is ...
		bool is_constant = false;
		if (ir.ids[rhs_id].get_type() == TypeConstant)
		{
			is_constant = true;
		}
		else if (var && var->remapped_variable && var->statically_assigned &&
		         ir.ids[var->static_expression].get_type() == TypeConstant)
		{
			is_constant = true;
		}
		else if (rhs_storage == StorageClassUniform)
		{
			is_constant = true;
		}

		// For the case where we have OpLoad triggering an array copy,
		// we cannot easily detect this case ahead of time since it's
		// context dependent. We might have to force a recompile here
		// if this is the only use of array copies in our shader.
		if (type.array.size() > 1)
		{
			if (type.array.size() > kArrayCopyMultidimMax)
				SPIRV_CROSS_THROW("Cannot support this many dimensions for arrays of arrays.");
			auto func = static_cast<SPVFuncImpl>(SPVFuncImplArrayCopyMultidimBase + type.array.size());
			add_spv_func_and_recompile(func);
		}
		else
			add_spv_func_and_recompile(SPVFuncImplArrayCopy);

		const char *tag = nullptr;
		if (lhs_thread && is_constant)
			tag = "FromConstantToStack";
		else if (lhs_storage == StorageClassWorkgroup && is_constant)
			tag = "FromConstantToThreadGroup";
		else if (lhs_thread && rhs_thread)
			tag = "FromStackToStack";
		else if (lhs_storage == StorageClassWorkgroup && rhs_thread)
			tag = "FromStackToThreadGroup";
		else if (lhs_thread && rhs_storage == StorageClassWorkgroup)
			tag = "FromThreadGroupToStack";
		else if (lhs_storage == StorageClassWorkgroup && rhs_storage == StorageClassWorkgroup)
			tag = "FromThreadGroupToThreadGroup";
		else if (lhs_storage == StorageClassStorageBuffer && rhs_storage == StorageClassStorageBuffer)
			tag = "FromDeviceToDevice";
		else if (lhs_storage == StorageClassStorageBuffer && is_constant)
			tag = "FromConstantToDevice";
		else if (lhs_storage == StorageClassStorageBuffer && rhs_storage == StorageClassWorkgroup)
			tag = "FromThreadGroupToDevice";
		else if (lhs_storage == StorageClassStorageBuffer && rhs_thread)
			tag = "FromStackToDevice";
		else if (lhs_storage == StorageClassWorkgroup && rhs_storage == StorageClassStorageBuffer)
			tag = "FromDeviceToThreadGroup";
		else if (lhs_thread && rhs_storage == StorageClassStorageBuffer)
			tag = "FromDeviceToStack";
		else
			SPIRV_CROSS_THROW("Unknown storage class used for copying arrays.");

		// Pass internal array of spvUnsafeArray<> into wrapper functions
		if (lhs_thread && !msl_options.force_native_arrays)
			statement("spvArrayCopy", tag, type.array.size(), "(", lhs, ".elements, ", to_expression(rhs_id), ");");
		else if (rhs_thread && !msl_options.force_native_arrays)
			statement("spvArrayCopy", tag, type.array.size(), "(", lhs, ", ", to_expression(rhs_id), ".elements);");
		else
			statement("spvArrayCopy", tag, type.array.size(), "(", lhs, ", ", to_expression(rhs_id), ");");
	}
}